

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlNewNs(xmlNodePtr node,xmlChar *href,xmlChar *prefix)

{
  _xmlNs *p_Var1;
  int iVar2;
  xmlNsPtr pxVar3;
  xmlChar *pxVar4;
  xmlNs *pxVar5;
  
  if ((node != (xmlNodePtr)0x0) && (node->type != XML_ELEMENT_NODE)) {
    return (xmlNsPtr)0x0;
  }
  pxVar3 = (xmlNsPtr)(*xmlMalloc)(0x30);
  if (pxVar3 == (xmlNsPtr)0x0) {
    return (xmlNsPtr)0x0;
  }
  pxVar3->next = (_xmlNs *)0x0;
  *(undefined8 *)&pxVar3->type = 0;
  pxVar3->_private = (void *)0x0;
  pxVar3->context = (_xmlDoc *)0x0;
  pxVar3->href = (xmlChar *)0x0;
  pxVar3->prefix = (xmlChar *)0x0;
  pxVar3->type = XML_NAMESPACE_DECL;
  if (href != (xmlChar *)0x0) {
    pxVar4 = xmlStrdup(href);
    pxVar3->href = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0014b765;
  }
  if (prefix != (xmlChar *)0x0) {
    pxVar4 = xmlStrdup(prefix);
    pxVar3->prefix = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0014b765;
  }
  if (node == (xmlNodePtr)0x0) {
    return pxVar3;
  }
  pxVar5 = node->nsDef;
  if (pxVar5 == (xmlNs *)0x0) {
    node->nsDef = pxVar3;
    return pxVar3;
  }
  pxVar4 = pxVar5->prefix;
  while ((iVar2 = xmlStrEqual(pxVar4,pxVar3->prefix), iVar2 == 0 || (pxVar5->href == (xmlChar *)0x0)
         )) {
    p_Var1 = pxVar5->next;
    if (p_Var1 == (_xmlNs *)0x0) {
      pxVar5->next = pxVar3;
      return pxVar3;
    }
    pxVar4 = p_Var1->prefix;
    pxVar5 = p_Var1;
  }
LAB_0014b765:
  if (pxVar3->href != (xmlChar *)0x0) {
    (*xmlFree)(pxVar3->href);
  }
  if (pxVar3->prefix != (xmlChar *)0x0) {
    (*xmlFree)(pxVar3->prefix);
  }
  (*xmlFree)(pxVar3);
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlNewNs(xmlNodePtr node, const xmlChar *href, const xmlChar *prefix) {
    xmlNsPtr cur;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE))
	return(NULL);

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_LOCAL_NAMESPACE;

    if (href != NULL) {
	cur->href = xmlStrdup(href);
        if (cur->href == NULL)
            goto error;
    }
    if (prefix != NULL) {
	cur->prefix = xmlStrdup(prefix);
        if (cur->prefix == NULL)
            goto error;
    }

    /*
     * Add it at the end to preserve parsing order ...
     * and checks for existing use of the prefix
     */
    if (node != NULL) {
	if (node->nsDef == NULL) {
	    node->nsDef = cur;
	} else {
	    xmlNsPtr prev = node->nsDef;

	    if ((xmlStrEqual(prev->prefix, cur->prefix)) &&
                (prev->href != NULL))
                goto error;
	    while (prev->next != NULL) {
	        prev = prev->next;
		if ((xmlStrEqual(prev->prefix, cur->prefix)) &&
                    (prev->href != NULL))
                    goto error;
	    }
	    prev->next = cur;
	}
    }
    return(cur);

error:
    xmlFreeNs(cur);
    return(NULL);
}